

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EntityMarking.cpp
# Opt level: O0

void __thiscall
KDIS::DATA_TYPE::EntityMarking::SetEntityMarkingString
          (EntityMarking *this,KINT8 *EMS,KUINT16 StringSize)

{
  KException *this_00;
  allocator<char> local_41;
  KString local_40;
  KUINT16 local_1a;
  KINT8 *pKStack_18;
  KUINT16 StringSize_local;
  KINT8 *EMS_local;
  EntityMarking *this_local;
  
  local_1a = StringSize;
  pKStack_18 = EMS;
  EMS_local = (KINT8 *)this;
  if (0xb < StringSize) {
    this_00 = (KException *)__cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,"SetEntityMarkingString",&local_41);
    KException::KException(this_00,&local_40,3);
    __cxa_throw(this_00,&KException::typeinfo,KException::~KException);
  }
  memcpy(this->m_sEntityMarkingString,EMS,(ulong)StringSize);
  this->m_sEntityMarkingString[local_1a] = '\0';
  return;
}

Assistant:

void EntityMarking::SetEntityMarkingString(const KINT8 *EMS, KUINT16 StringSize) noexcept(false)
{
    if( StringSize > 11 ) throw KException( __FUNCTION__, STRING_PDU_SIZE_TOO_BIG );

    memcpy( m_sEntityMarkingString, EMS, StringSize );
    m_sEntityMarkingString[StringSize] = 0x0; // Null terminate the string.
}